

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_READ_MINDS(effect_handler_context_t_conflict *context)

{
  wchar_t y;
  wchar_t x;
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  monster *pmVar4;
  bool bVar5;
  source sVar6;
  source origin;
  source origin_00;
  
  y = context->y;
  if (y == L'\0') {
    y = (context->value).dice;
  }
  x = context->x;
  if (x == L'\0') {
    x = (context->value).sides;
  }
  wVar2 = cave_monster_max(cave);
  if (L'\x01' < wVar2) {
    wVar2 = L'\x01';
    bVar5 = false;
    do {
      pmVar4 = cave_monster(cave,wVar2);
      if (pmVar4->race != (monster_race *)0x0) {
        _Var1 = flag_has_dbg(pmVar4->mflag,2,5,"mon->mflag","MFLAG_MARK");
        if (_Var1) {
          sVar6 = source_monster(wVar2);
          origin.which = sVar6.which;
          origin._4_4_ = 0;
          origin.what = sVar6.what;
          effect_simple(L'\x1d',origin,"0",L'\0',L'\0',L'\0',y,x,(_Bool *)0x0);
          bVar5 = true;
        }
      }
      wVar2 = wVar2 + L'\x01';
      wVar3 = cave_monster_max(cave);
    } while (wVar2 < wVar3);
    if (bVar5) {
      msg("Images form in your mind!");
      context->ident = true;
      if (context->other != 0) {
        sVar6 = source_player();
        origin_00.which = sVar6.which;
        origin_00._4_4_ = 0;
        origin_00.what = sVar6.what;
        effect_simple(L'\x1f',origin_00,"0",L'\0',L'\0',L'\0',cave->height,cave->width,(_Bool *)0x0)
        ;
      }
    }
  }
  return true;
}

Assistant:

bool effect_handler_READ_MINDS(effect_handler_context_t *context)
{
	int i;
	int dist_y = context->y ? context->y : context->value.dice;
	int dist_x = context->x ? context->x : context->value.sides;
	bool found = false;

	/* Scan monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Detect all appropriate monsters */
		if (mflag_has(mon->mflag, MFLAG_MARK)) {
			/* Map around it */
			effect_simple(EF_MAP_AREA, source_monster(i), "0", 0, 0, 0,
						  dist_y, dist_x, NULL);
			found = true;
		}
	}

	if (found) {
		msg("Images form in your mind!");
		context->ident = true;
		if (context->other) {
			effect_simple(EF_DETECT_TRAPS, source_player(), "0", 0, 0, 0,
						  cave->height, cave->width, NULL);
		}
	}

	return true;
}